

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *window)

{
  float fVar1;
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [56];
  undefined1 in_ZMM1 [64];
  undefined1 auVar5 [56];
  ImRect IVar6;
  ImVec2 padding;
  ImGuiContext *g;
  ImRect r_screen;
  float local_3c;
  float local_34;
  ImVec2 local_30;
  ImVec2 local_28;
  ImGuiContext *local_20;
  ImRect local_10;
  undefined1 auVar2 [64];
  undefined1 auVar4 [64];
  
  auVar5 = in_ZMM1._8_56_;
  auVar3 = in_ZMM0._8_56_;
  local_20 = GImGui;
  GetMainViewport();
  IVar6 = ImGuiViewportP::GetMainRect((ImGuiViewportP *)0x1cc755);
  auVar4._0_8_ = IVar6.Max;
  auVar4._8_56_ = auVar5;
  auVar2._0_8_ = IVar6.Min;
  auVar2._8_56_ = auVar3;
  local_10.Min = (ImVec2)vmovlpd_avx(auVar2._0_16_);
  local_10.Max = (ImVec2)vmovlpd_avx(auVar4._0_16_);
  local_28 = (local_20->Style).DisplaySafeAreaPadding;
  fVar1 = ImRect::GetWidth(&local_10);
  if (fVar1 <= local_28.x * 2.0) {
    local_34 = 0.0;
  }
  else {
    local_34 = -local_28.x;
  }
  fVar1 = ImRect::GetHeight(&local_10);
  if (fVar1 <= local_28.y * 2.0) {
    local_3c = 0.0;
  }
  else {
    local_3c = -local_28.y;
  }
  ImVec2::ImVec2(&local_30,local_34,local_3c);
  ImRect::Expand(&local_10,&local_30);
  IVar6.Max = local_10.Max;
  IVar6.Min = local_10.Min;
  return IVar6;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_UNUSED(window);
    ImRect r_screen = ((ImGuiViewportP*)(void*)GetMainViewport())->GetMainRect();
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}